

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floattype.cpp
# Opt level: O3

void __thiscall FloatType::FloatType(FloatType *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  _Invoker_type p_Var4;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l;
  initializer_list<std::pair<const_OperatorChar,_Operator>_> __l_00;
  initializer_list<Function> __l_01;
  allocator_type local_f32;
  char local_f31 [5];
  OperatorChar local_f2c;
  OperatorChar local_f28;
  OperatorChar local_f24;
  OperatorChar local_f20;
  OperatorChar local_f1c;
  OperatorChar local_f18;
  OperatorChar local_f14;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_f10;
  _Any_data local_f08;
  code *local_ef8;
  code *local_ef0;
  string local_ee8;
  _Any_data local_ec8;
  code *local_eb8;
  code *local_eb0;
  string local_ea8;
  string local_e88;
  _Any_data local_e68;
  code *local_e58;
  code *local_e50;
  string local_e48;
  string local_e28;
  _Any_data local_e08;
  code *local_df8;
  code *local_df0;
  string local_de8;
  string local_dc8;
  _Any_data local_da8;
  code *local_d98;
  code *local_d90;
  string local_d88;
  string local_d68;
  _Any_data local_d48;
  code *local_d38;
  code *local_d30;
  string local_d28;
  string local_d08;
  _Any_data local_ce8;
  code *local_cd8;
  code *local_cd0;
  string local_cc8;
  string local_ca8;
  _Any_data local_c88;
  code *local_c78;
  code *local_c70;
  string local_c68;
  string local_c48;
  _Any_data local_c28;
  code *local_c18;
  code *local_c10;
  string local_c08;
  string local_be8;
  _Any_data local_bc8;
  code *local_bb8;
  code *local_bb0;
  string local_ba8;
  string local_b88;
  _Any_data local_b68;
  code *local_b58;
  code *local_b50;
  string local_b48;
  string local_b28;
  _Any_data local_b08;
  code *local_af8;
  code *local_af0;
  string local_ae8;
  string local_ac8;
  _Any_data local_aa8;
  code *local_a98;
  code *local_a90;
  string local_a88;
  UnaryOperators *local_a68;
  string local_a60;
  string local_a40;
  undefined1 local_a20 [72];
  _Invoker_type local_9d8;
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [64];
  _Any_data local_978;
  code *local_968;
  code *local_960;
  _Any_data local_958;
  code *local_948;
  code *local_940;
  _Any_data local_938;
  code *local_928;
  code *local_920;
  _Any_data local_918;
  code *local_908;
  code *local_900;
  _Any_data local_8f8;
  code *local_8e8;
  code *local_8e0;
  _Any_data local_8d8;
  code *local_8c8;
  code *local_8c0;
  _Any_data local_8b8;
  code *local_8a8;
  code *local_8a0;
  Operator local_898;
  undefined1 local_848 [16];
  _Any_data local_838;
  _Manager_type local_828;
  _Any_data local_818;
  _Manager_type local_808;
  undefined1 local_7f8 [32];
  _Manager_type local_7d8;
  undefined1 local_7c8 [16];
  _Manager_type local_7b8;
  Operator local_788;
  Operator local_738;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_6e8;
  undefined1 local_6b0 [56];
  _Any_data local_678;
  _Manager_type local_668;
  undefined1 local_658 [88];
  undefined1 local_600 [88];
  pair<const_OperatorChar,_Operator> local_5a8;
  undefined1 local_550 [88];
  undefined1 local_4f8 [200];
  Function local_430;
  Function local_3b0;
  Function local_330;
  Function local_2b0;
  Function local_230;
  Function local_1b0;
  Function local_130;
  Function local_b0;
  
  (this->super_NumberType)._vptr_NumberType = (_func_int **)&PTR__FloatType_00147a18;
  (this->mBinaryOperators)._M_h._M_buckets = &(this->mBinaryOperators)._M_h._M_single_bucket;
  (this->mBinaryOperators)._M_h._M_bucket_count = 1;
  (this->mBinaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mBinaryOperators)._M_h._M_element_count = 0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mBinaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mBinaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mUnaryOperators)._M_h._M_buckets = &(this->mUnaryOperators)._M_h._M_single_bucket;
  (this->mUnaryOperators)._M_h._M_bucket_count = 1;
  (this->mUnaryOperators)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mUnaryOperators)._M_h._M_element_count = 0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mUnaryOperators)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mUnaryOperators)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f10 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)&this->mEnvironment;
  local_a68 = &this->mUnaryOperators;
  EnvironmentScope::EnvironmentScope((EnvironmentScope *)local_f10);
  local_f31[4] = 0x5e;
  OperatorChar::OperatorChar(&local_f14,'^');
  local_8b8._M_unused._M_object = (void *)0x0;
  local_8b8._8_8_ = 0;
  local_8a0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:5:65)>
              ::_M_invoke;
  local_8a8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:5:65)>
              ::_M_manager;
  Operator::binary((Operator *)local_a20,local_f14,6,RIGHT,(BinaryOperatorFn *)&local_8b8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_6b0,local_f31 + 4,(Operator *)local_a20);
  local_f32 = (allocator_type)0x2a;
  OperatorChar::OperatorChar(&local_f18,'*');
  local_8d8._M_unused._M_object = (void *)0x0;
  local_8d8._8_8_ = 0;
  local_8c0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:8:64)>
              ::_M_invoke;
  local_8c8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:8:64)>
              ::_M_manager;
  Operator::binary((Operator *)local_7f8,local_f18,5,LEFT,(BinaryOperatorFn *)&local_8d8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_658,(char *)&local_f32,
             (Operator *)local_7f8);
  local_f31[3] = 0x2f;
  OperatorChar::OperatorChar(&local_f1c,'/');
  local_8f8._M_unused._M_object = (void *)0x0;
  local_8f8._8_8_ = 0;
  local_8e0 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:11:64)>
              ::_M_invoke;
  local_8e8 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:11:64)>
              ::_M_manager;
  Operator::binary((Operator *)local_848,local_f1c,5,LEFT,(BinaryOperatorFn *)&local_8f8);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_600,local_f31 + 3,(Operator *)local_848);
  local_f31[2] = 0x2b;
  OperatorChar::OperatorChar(&local_f20,'+');
  local_918._M_unused._M_object = (void *)0x0;
  local_918._8_8_ = 0;
  local_900 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:14:64)>
              ::_M_invoke;
  local_908 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:14:64)>
              ::_M_manager;
  Operator::binary(&local_898,local_f20,4,LEFT,(BinaryOperatorFn *)&local_918);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            (&local_5a8,local_f31 + 2,&local_898);
  local_f31[1] = 0x2d;
  OperatorChar::OperatorChar(&local_f24,'-');
  local_938._M_unused._M_object = (void *)0x0;
  local_938._8_8_ = 0;
  local_920 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:17:64)>
              ::_M_invoke;
  local_928 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:17:64)>
              ::_M_manager;
  Operator::binary(&local_738,local_f24,4,LEFT,(BinaryOperatorFn *)&local_938);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_550,local_f31 + 1,&local_738);
  local_f31[0] = '=';
  OperatorChar::OperatorChar(&local_f28,'=');
  local_958._M_unused._M_object = (void *)0x0;
  local_958._8_8_ = 0;
  local_940 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:20:65)>
              ::_M_invoke;
  local_948 = std::
              _Function_handler<ResultValue_(ResultValue,_ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:20:65)>
              ::_M_manager;
  Operator::binary(&local_788,local_f28,1,RIGHT,(BinaryOperatorFn *)&local_958);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_4f8,local_f31,&local_788);
  __l._M_len = 6;
  __l._M_array = (iterator)local_6b0;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->mBinaryOperators)._M_h,__l);
  lVar3 = -0x210;
  puVar1 = local_4f8 + 0x18;
  do {
    if (*(code **)(puVar1 + 0x30) != (code *)0x0) {
      (**(code **)(puVar1 + 0x30))(puVar1 + 0x20,puVar1 + 0x20,3);
    }
    if (*(code **)(puVar1 + 0x10) != (code *)0x0) {
      (**(code **)(puVar1 + 0x10))(puVar1,puVar1,3);
    }
    puVar1 = puVar1 + -0x58;
    lVar3 = lVar3 + 0x58;
  } while (lVar3 != 0);
  if (local_788.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_788.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_788.mUnaryFn,(_Any_data *)&local_788.mUnaryFn,__destroy_functor);
  }
  if (local_788.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_788.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_788.mBinaryFn,(_Any_data *)&local_788.mBinaryFn,__destroy_functor
              );
  }
  if (local_948 != (code *)0x0) {
    (*local_948)(&local_958,&local_958,__destroy_functor);
  }
  if (local_738.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_738.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_738.mUnaryFn,(_Any_data *)&local_738.mUnaryFn,__destroy_functor);
  }
  if (local_738.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_738.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_738.mBinaryFn,(_Any_data *)&local_738.mBinaryFn,__destroy_functor
              );
  }
  if (local_928 != (code *)0x0) {
    (*local_928)(&local_938,&local_938,__destroy_functor);
  }
  if (local_898.mUnaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_898.mUnaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_898.mUnaryFn,(_Any_data *)&local_898.mUnaryFn,__destroy_functor);
  }
  if (local_898.mBinaryFn.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_898.mBinaryFn.super__Function_base._M_manager)
              ((_Any_data *)&local_898.mBinaryFn,(_Any_data *)&local_898.mBinaryFn,__destroy_functor
              );
  }
  if (local_908 != (code *)0x0) {
    (*local_908)(&local_918,&local_918,__destroy_functor);
  }
  if (local_808 != (_Manager_type)0x0) {
    (*local_808)(&local_818,&local_818,__destroy_functor);
  }
  if (local_828 != (_Manager_type)0x0) {
    (*local_828)(&local_838,&local_838,__destroy_functor);
  }
  if (local_8e8 != (code *)0x0) {
    (*local_8e8)(&local_8f8,&local_8f8,__destroy_functor);
  }
  if (local_7b8 != (_Manager_type)0x0) {
    (*local_7b8)((_Any_data *)local_7c8,(_Any_data *)local_7c8,__destroy_functor);
  }
  if (local_7d8 != (_Manager_type)0x0) {
    (*local_7d8)((_Any_data *)(local_7f8 + 0x10),(_Any_data *)(local_7f8 + 0x10),__destroy_functor);
  }
  if (local_8c8 != (code *)0x0) {
    (*local_8c8)(&local_8d8,&local_8d8,__destroy_functor);
  }
  if ((_Manager_type)local_a20._64_8_ != (_Manager_type)0x0) {
    (*(code *)local_a20._64_8_)
              ((_Any_data *)(local_a20 + 0x30),(_Any_data *)(local_a20 + 0x30),__destroy_functor);
  }
  if ((_Manager_type)local_a20._32_8_ != (_Manager_type)0x0) {
    (*(code *)local_a20._32_8_)
              ((_Any_data *)(local_a20 + 0x10),(_Any_data *)(local_a20 + 0x10),__destroy_functor);
  }
  if (local_8a8 != (code *)0x0) {
    (*local_8a8)(&local_8b8,&local_8b8,__destroy_functor);
  }
  local_7f8[0] = true;
  OperatorChar::OperatorChar(&local_f2c,'-');
  local_978._M_unused._M_object = (void *)0x0;
  local_978._8_8_ = 0;
  local_960 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:26:63)>
              ::_M_invoke;
  local_968 = std::
              _Function_handler<ResultValue_(ResultValue),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:26:63)>
              ::_M_manager;
  Operator::unary((Operator *)local_a20,local_f2c,7,LEFT,(UnaryOperatorFn *)&local_978);
  std::pair<const_OperatorChar,_Operator>::pair<char,_Operator,_true>
            ((pair<const_OperatorChar,_Operator> *)local_6b0,local_7f8,(Operator *)local_a20);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_6b0;
  std::
  _Hashtable<OperatorChar,_std::pair<const_OperatorChar,_Operator>,_std::allocator<std::pair<const_OperatorChar,_Operator>_>,_std::__detail::_Select1st,_std::equal_to<OperatorChar>,_std::hash<OperatorChar>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(this->mUnaryOperators)._M_h,__l_00);
  if (local_668 != (_Manager_type)0x0) {
    (*local_668)(&local_678,&local_678,__destroy_functor);
  }
  if ((_Manager_type)local_6b0._40_8_ != (_Manager_type)0x0) {
    (*(code *)local_6b0._40_8_)
              ((_Any_data *)(local_6b0 + 0x18),(_Any_data *)(local_6b0 + 0x18),__destroy_functor);
  }
  if ((_Manager_type)local_a20._64_8_ != (_Manager_type)0x0) {
    (*(code *)local_a20._64_8_)
              ((_Any_data *)(local_a20 + 0x30),(_Any_data *)(local_a20 + 0x30),__destroy_functor);
  }
  if ((_Manager_type)local_a20._32_8_ != (_Manager_type)0x0) {
    (*(code *)local_a20._32_8_)
              ((_Any_data *)(local_a20 + 0x10),(_Any_data *)(local_a20 + 0x10),__destroy_functor);
  }
  if (local_968 != (code *)0x0) {
    (*local_968)(&local_978,&local_978,__destroy_functor);
  }
  ResultValue::ResultValue((ResultValue *)local_848,3.141592653589793);
  local_a20._0_8_ = local_a20 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a20,"pi","");
  local_a20._64_8_ = local_828;
  local_a20._48_8_ = local_838._M_unused._M_object;
  local_a20._56_8_ = local_838._8_8_;
  local_a20._32_8_ = local_848._0_8_;
  local_a20._40_8_ = local_848._8_8_;
  ResultValue::ResultValue((ResultValue *)&local_898,2.718281828459045);
  p_Var4 = (_Invoker_type)local_9c8;
  local_9d8 = p_Var4;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_9d8,"e","");
  local_9b8._32_8_ = local_898.mBinaryFn.super__Function_base._M_manager;
  local_9b8._16_4_ = local_898.mBinaryFn.super__Function_base._M_functor._0_4_;
  local_9b8._20_4_ = local_898.mBinaryFn.super__Function_base._M_functor._4_4_;
  local_9b8._24_4_ = local_898.mBinaryFn.super__Function_base._M_functor._8_4_;
  local_9b8._28_4_ = local_898.mBinaryFn.super__Function_base._M_functor._12_4_;
  local_9b8._0_4_ = local_898._0_4_;
  local_9b8._4_4_ = local_898.mPrecedence;
  local_9b8._8_4_ = local_898.mAssociativity;
  local_9b8._12_4_ = local_898._12_4_;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,ResultValue>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ResultValue>,std::allocator<std::pair<std::__cxx11::string_const,ResultValue>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_6e8,local_a20,local_9b8 + 0x28,0,&local_738,&local_788,local_f31 + 4);
  local_a88._M_dataplus._M_p = (pointer)&local_a88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a88,"sin","");
  local_aa8._8_8_ = 0;
  local_a90 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:35:30)>
              ::_M_invoke;
  local_a98 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:35:30)>
              ::_M_manager;
  local_ac8._M_dataplus._M_p = (pointer)&local_ac8.field_2;
  local_aa8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ac8,"Computes the sine of x.","")
  ;
  Function::Function((Function *)local_6b0,&local_a88,1,(ExternalFunction *)&local_aa8,&local_ac8);
  local_ae8._M_dataplus._M_p = (pointer)&local_ae8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ae8,"cos","");
  local_b08._8_8_ = 0;
  local_af0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:38:30)>
              ::_M_invoke;
  local_af8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:38:30)>
              ::_M_manager;
  local_b28._M_dataplus._M_p = (pointer)&local_b28.field_2;
  local_b08._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b28,"Computes the cosine of x.","");
  Function::Function((Function *)(local_658 + 0x28),&local_ae8,1,(ExternalFunction *)&local_b08,
                     &local_b28);
  local_b48._M_dataplus._M_p = (pointer)&local_b48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b48,"tan","");
  local_b68._8_8_ = 0;
  local_b50 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:41:30)>
              ::_M_invoke;
  local_b58 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:41:30)>
              ::_M_manager;
  local_b88._M_dataplus._M_p = (pointer)&local_b88.field_2;
  local_b68._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b88,"Computes the tangent of x.","");
  Function::Function((Function *)(local_600 + 0x50),&local_b48,1,(ExternalFunction *)&local_b68,
                     &local_b88);
  local_ba8._M_dataplus._M_p = (pointer)&local_ba8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ba8,"sqrt","");
  local_bc8._8_8_ = 0;
  local_bb0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:44:31)>
              ::_M_invoke;
  local_bb8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:44:31)>
              ::_M_manager;
  local_be8._M_dataplus._M_p = (pointer)&local_be8.field_2;
  local_bc8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_be8,"Computes the square root of x.","");
  Function::Function((Function *)(local_550 + 0x20),&local_ba8,1,(ExternalFunction *)&local_bc8,
                     &local_be8);
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c08,"asin","");
  local_c28._8_8_ = 0;
  local_c10 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:47:31)>
              ::_M_invoke;
  local_c18 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:47:31)>
              ::_M_manager;
  local_c48._M_dataplus._M_p = (pointer)&local_c48.field_2;
  local_c28._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_c48,"Computes the inverse sine of x.","");
  Function::Function((Function *)(local_4f8 + 0x48),&local_c08,1,(ExternalFunction *)&local_c28,
                     &local_c48);
  local_c68._M_dataplus._M_p = (pointer)&local_c68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c68,"acos","");
  local_c88._8_8_ = 0;
  local_c70 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:50:31)>
              ::_M_invoke;
  local_c78 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:50:31)>
              ::_M_manager;
  local_ca8._M_dataplus._M_p = (pointer)&local_ca8.field_2;
  local_c88._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_ca8,"Computes the inverse cosine of x.","");
  Function::Function(&local_430,&local_c68,1,(ExternalFunction *)&local_c88,&local_ca8);
  local_cc8._M_dataplus._M_p = (pointer)&local_cc8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_cc8,"atan","");
  local_ce8._8_8_ = 0;
  local_cd0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:53:31)>
              ::_M_invoke;
  local_cd8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:53:31)>
              ::_M_manager;
  local_d08._M_dataplus._M_p = (pointer)&local_d08.field_2;
  local_ce8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d08,"Computes the inverse tangent of x.","");
  Function::Function(&local_3b0,&local_cc8,1,(ExternalFunction *)&local_ce8,&local_d08);
  local_d28._M_dataplus._M_p = (pointer)&local_d28.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d28,"ln","");
  local_d48._8_8_ = 0;
  local_d30 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:56:29)>
              ::_M_invoke;
  local_d38 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:56:29)>
              ::_M_manager;
  local_d68._M_dataplus._M_p = (pointer)&local_d68.field_2;
  local_d48._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d68,"Computes the natural logarithm of x.","");
  Function::Function(&local_330,&local_d28,1,(ExternalFunction *)&local_d48,&local_d68);
  local_d88._M_dataplus._M_p = (pointer)&local_d88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d88,"log","");
  local_da8._8_8_ = 0;
  local_d90 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:59:30)>
              ::_M_invoke;
  local_d98 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:59:30)>
              ::_M_manager;
  local_dc8._M_dataplus._M_p = (pointer)&local_dc8.field_2;
  local_da8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_dc8,"Computes the 10-logarithm of x.","");
  Function::Function(&local_2b0,&local_d88,1,(ExternalFunction *)&local_da8,&local_dc8);
  local_de8._M_dataplus._M_p = (pointer)&local_de8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_de8,"logb","");
  local_e08._8_8_ = 0;
  local_df0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:62:31)>
              ::_M_invoke;
  local_df8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:62:31)>
              ::_M_manager;
  local_e28._M_dataplus._M_p = (pointer)&local_e28.field_2;
  local_e08._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_e28,"Computes the y-logarithm of x.","");
  Function::Function(&local_230,&local_de8,2,(ExternalFunction *)&local_e08,&local_e28);
  local_e48._M_dataplus._M_p = (pointer)&local_e48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e48,"ceil","");
  local_e68._8_8_ = 0;
  local_e50 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:65:31)>
              ::_M_invoke;
  local_e58 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:65:31)>
              ::_M_manager;
  local_e88._M_dataplus._M_p = (pointer)&local_e88.field_2;
  local_e68._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e88,"Ceils x.","");
  Function::Function(&local_1b0,&local_e48,1,(ExternalFunction *)&local_e68,&local_e88);
  local_ea8._M_dataplus._M_p = (pointer)&local_ea8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ea8,"floor","");
  local_ec8._8_8_ = 0;
  local_eb0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:68:32)>
              ::_M_invoke;
  local_eb8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:68:32)>
              ::_M_manager;
  local_ee8._M_dataplus._M_p = (pointer)&local_ee8.field_2;
  local_ec8._M_unused._M_object = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_ee8,"Floors x.","");
  Function::Function(&local_130,&local_ea8,1,(ExternalFunction *)&local_ec8,&local_ee8);
  local_a40._M_dataplus._M_p = (pointer)&local_a40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a40,"round","");
  local_f08._8_8_ = 0;
  local_ef0 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:71:32)>
              ::_M_invoke;
  local_ef8 = std::
              _Function_handler<ResultValue_(std::vector<ResultValue,_std::allocator<ResultValue>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/svenslaggare[P]termcalc/src/calculation/numbertypes/floattype.cpp:71:32)>
              ::_M_manager;
  local_f08._M_unused._M_object = this;
  local_a60._M_dataplus._M_p = (pointer)&local_a60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a60,"Rounds x.","");
  Function::Function(&local_b0,&local_a40,1,(ExternalFunction *)&local_f08,&local_a60);
  __l_01._M_len = 0xd;
  __l_01._M_array = (iterator)local_6b0;
  std::vector<Function,_std::allocator<Function>_>::vector
            ((vector<Function,_std::allocator<Function>_> *)(local_9b8 + 0x28),__l_01,&local_f32);
  EnvironmentScope::EnvironmentScope
            ((EnvironmentScope *)local_7f8,(Variables *)&local_6e8,
             (vector<Function,_std::allocator<Function>_> *)(local_9b8 + 0x28));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(local_f10,local_7f8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&(this->mEnvironment).mFunctions._M_h,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_7c8 + 8));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Function>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_7c8 + 8));
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_7f8);
  std::vector<Function,_std::allocator<Function>_>::~vector
            ((vector<Function,_std::allocator<Function>_> *)(local_9b8 + 0x28));
  lVar3 = -0x680;
  paVar2 = &local_b0.mInfoText.field_2;
  do {
    if (paVar2 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(&paVar2->_M_allocated_capacity)[-2]) {
      operator_delete((long *)(&paVar2->_M_allocated_capacity)[-2],paVar2->_M_allocated_capacity + 1
                     );
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(&paVar2->_M_allocated_capacity)[-3] !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (&paVar2->_M_allocated_capacity)[-3]);
    }
    if ((code *)(&paVar2->_M_allocated_capacity)[-6] != (code *)0x0) {
      (*(code *)(&paVar2->_M_allocated_capacity)[-6])
                (&paVar2->_M_allocated_capacity + -8,&paVar2->_M_allocated_capacity + -8,3);
    }
    if (&paVar2->_M_allocated_capacity + -0xc != (size_type *)(&paVar2->_M_allocated_capacity)[-0xe]
       ) {
      operator_delete((size_type *)(&paVar2->_M_allocated_capacity)[-0xe],
                      (&paVar2->_M_allocated_capacity)[-0xc] + 1);
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(&paVar2->_M_allocated_capacity + -0x10);
    lVar3 = lVar3 + 0x80;
  } while (lVar3 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60._M_dataplus._M_p != &local_a60.field_2) {
    operator_delete(local_a60._M_dataplus._M_p,local_a60.field_2._M_allocated_capacity + 1);
  }
  if (local_ef8 != (code *)0x0) {
    (*local_ef8)(&local_f08,&local_f08,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a40._M_dataplus._M_p != &local_a40.field_2) {
    operator_delete(local_a40._M_dataplus._M_p,local_a40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ee8._M_dataplus._M_p != &local_ee8.field_2) {
    operator_delete(local_ee8._M_dataplus._M_p,local_ee8.field_2._M_allocated_capacity + 1);
  }
  if (local_eb8 != (code *)0x0) {
    (*local_eb8)(&local_ec8,&local_ec8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ea8._M_dataplus._M_p != &local_ea8.field_2) {
    operator_delete(local_ea8._M_dataplus._M_p,local_ea8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e88._M_dataplus._M_p != &local_e88.field_2) {
    operator_delete(local_e88._M_dataplus._M_p,local_e88.field_2._M_allocated_capacity + 1);
  }
  if (local_e58 != (code *)0x0) {
    (*local_e58)(&local_e68,&local_e68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e48._M_dataplus._M_p != &local_e48.field_2) {
    operator_delete(local_e48._M_dataplus._M_p,local_e48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e28._M_dataplus._M_p != &local_e28.field_2) {
    operator_delete(local_e28._M_dataplus._M_p,local_e28.field_2._M_allocated_capacity + 1);
  }
  if (local_df8 != (code *)0x0) {
    (*local_df8)(&local_e08,&local_e08,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_de8._M_dataplus._M_p != &local_de8.field_2) {
    operator_delete(local_de8._M_dataplus._M_p,local_de8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_dc8._M_dataplus._M_p != &local_dc8.field_2) {
    operator_delete(local_dc8._M_dataplus._M_p,local_dc8.field_2._M_allocated_capacity + 1);
  }
  if (local_d98 != (code *)0x0) {
    (*local_d98)(&local_da8,&local_da8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d88._M_dataplus._M_p != &local_d88.field_2) {
    operator_delete(local_d88._M_dataplus._M_p,local_d88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d68._M_dataplus._M_p != &local_d68.field_2) {
    operator_delete(local_d68._M_dataplus._M_p,local_d68.field_2._M_allocated_capacity + 1);
  }
  if (local_d38 != (code *)0x0) {
    (*local_d38)(&local_d48,&local_d48,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d28._M_dataplus._M_p != &local_d28.field_2) {
    operator_delete(local_d28._M_dataplus._M_p,local_d28.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d08._M_dataplus._M_p != &local_d08.field_2) {
    operator_delete(local_d08._M_dataplus._M_p,local_d08.field_2._M_allocated_capacity + 1);
  }
  if (local_cd8 != (code *)0x0) {
    (*local_cd8)(&local_ce8,&local_ce8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_cc8._M_dataplus._M_p != &local_cc8.field_2) {
    operator_delete(local_cc8._M_dataplus._M_p,local_cc8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ca8._M_dataplus._M_p != &local_ca8.field_2) {
    operator_delete(local_ca8._M_dataplus._M_p,local_ca8.field_2._M_allocated_capacity + 1);
  }
  if (local_c78 != (code *)0x0) {
    (*local_c78)(&local_c88,&local_c88,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c68._M_dataplus._M_p != &local_c68.field_2) {
    operator_delete(local_c68._M_dataplus._M_p,local_c68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c48._M_dataplus._M_p != &local_c48.field_2) {
    operator_delete(local_c48._M_dataplus._M_p,local_c48.field_2._M_allocated_capacity + 1);
  }
  if (local_c18 != (code *)0x0) {
    (*local_c18)(&local_c28,&local_c28,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p,local_c08.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_be8._M_dataplus._M_p != &local_be8.field_2) {
    operator_delete(local_be8._M_dataplus._M_p,local_be8.field_2._M_allocated_capacity + 1);
  }
  if (local_bb8 != (code *)0x0) {
    (*local_bb8)(&local_bc8,&local_bc8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ba8._M_dataplus._M_p != &local_ba8.field_2) {
    operator_delete(local_ba8._M_dataplus._M_p,local_ba8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b88._M_dataplus._M_p != &local_b88.field_2) {
    operator_delete(local_b88._M_dataplus._M_p,local_b88.field_2._M_allocated_capacity + 1);
  }
  if (local_b58 != (code *)0x0) {
    (*local_b58)(&local_b68,&local_b68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b48._M_dataplus._M_p != &local_b48.field_2) {
    operator_delete(local_b48._M_dataplus._M_p,local_b48.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b28._M_dataplus._M_p != &local_b28.field_2) {
    operator_delete(local_b28._M_dataplus._M_p,local_b28.field_2._M_allocated_capacity + 1);
  }
  if (local_af8 != (code *)0x0) {
    (*local_af8)(&local_b08,&local_b08,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._M_dataplus._M_p != &local_ae8.field_2) {
    operator_delete(local_ae8._M_dataplus._M_p,local_ae8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if (local_a98 != (code *)0x0) {
    (*local_a98)(&local_aa8,&local_aa8,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a88._M_dataplus._M_p != &local_a88.field_2) {
    operator_delete(local_a88._M_dataplus._M_p,local_a88.field_2._M_allocated_capacity + 1);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_6e8);
  lVar3 = -0x90;
  do {
    if (p_Var4 != *(_Invoker_type *)(p_Var4 + -0x10)) {
      operator_delete(*(_Invoker_type *)(p_Var4 + -0x10),*(long *)p_Var4 + 1);
    }
    p_Var4 = p_Var4 + -0x48;
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0);
  return;
}

Assistant:

FloatType::FloatType() {
	mBinaryOperators = {
		{ '^', Operator::binary('^', 6, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return pow(lhs.floatValue(), rhs.floatValue());
		}) },
		{ '*', Operator::binary('*', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() * rhs.floatValue();
		}) },
		{ '/', Operator::binary('/', 5, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() / rhs.floatValue();
		}) },
		{ '+', Operator::binary('+', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() + rhs.floatValue();
		}) },
		{ '-', Operator::binary('-', 4, OperatorAssociativity::LEFT, [&](ResultValue lhs, ResultValue rhs) {
			return lhs.floatValue() - rhs.floatValue();
		}) },
		{ '=', Operator::binary('=', 1, OperatorAssociativity::RIGHT, [&](ResultValue lhs, ResultValue rhs) {
			return ResultValue();
		}) }
	};

	mUnaryOperators = {
		{ '-', Operator::unary('-', 7, OperatorAssociativity::LEFT, [&](ResultValue op) {
			return -op.floatValue();
		}) }
	};

	mEnvironment = EnvironmentScope({
										{ "pi", ResultValue(3.141592653589793238463) },
										{ "e", ResultValue(2.718281828459045235360) },
									}, {
										Function("sin", 1, [this](FunctionArguments args) {
											return ResultValue(sin(args.at(0).floatValue()));
										}, "Computes the sine of x."),
										Function("cos", 1, [this](FunctionArguments args) {
											return ResultValue(cos(args.at(0).floatValue()));
										}, "Computes the cosine of x."),
										Function("tan", 1, [this](FunctionArguments args) {
											return ResultValue(tan(args.at(0).floatValue()));
										}, "Computes the tangent of x."),
										Function("sqrt", 1, [this](FunctionArguments args) {
											return ResultValue(sqrt(args.at(0).floatValue()));
										}, "Computes the square root of x."),
										Function("asin", 1, [this](FunctionArguments args) {
											return ResultValue(asin(args.at(0).floatValue()));
										}, "Computes the inverse sine of x."),
										Function("acos", 1, [this](FunctionArguments args) {
											return ResultValue(acos(args.at(0).floatValue()));
										}, "Computes the inverse cosine of x."),
										Function("atan", 1, [this](FunctionArguments args) {
											return ResultValue(atan(args.at(0).floatValue()));
										}, "Computes the inverse tangent of x."),
										Function("ln", 1, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()));
										}, "Computes the natural logarithm of x."),
										Function("log", 1, [this](FunctionArguments args) {
											return ResultValue(log10(args.at(0).floatValue()));
										}, "Computes the 10-logarithm of x."),
										Function("logb", 2, [this](FunctionArguments args) {
											return ResultValue(log(args.at(0).floatValue()) / log(args.at(1).floatValue()));
										}, "Computes the y-logarithm of x."),
										Function("ceil", 1, [this](FunctionArguments x) {
											return ResultValue(ceil(x.at(0).floatValue()));
										}, "Ceils x."),
										Function("floor", 1, [this](FunctionArguments x) {
											return ResultValue(floor(x.at(0).floatValue()));
										}, "Floors x."),
										Function("round", 1, [this](FunctionArguments x) {
											return ResultValue(round(x.at(0).floatValue()));
										}, "Rounds x."),
									});
}